

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::String&,char_const(&)[26],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [26],
          unsigned_long *params_2)

{
  long lVar1;
  ArrayPtr<const_char> local_70;
  long local_60;
  long local_58;
  CappedArray<char,_26UL> local_50;
  
  lVar1 = *(long *)(this + 8);
  local_60 = lVar1;
  if (lVar1 != 0) {
    local_60 = *(long *)this;
  }
  local_58 = 0;
  if (lVar1 != 0) {
    local_58 = lVar1 + -1;
  }
  local_70.size_ = strlen((char *)params);
  local_70.ptr = (char *)params;
  _::Stringifier::operator*(&local_50,(Stringifier *)&_::STR,*(unsigned_long *)*params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_60,&local_70,(ArrayPtr<const_char> *)&local_50,
             (CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}